

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *name;
  uint uVar1;
  ulong uVar2;
  test *ptVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int n;
  char **local_4040;
  test *tests_to_run [1024];
  test *tests [1024];
  
  uVar6 = 0;
  local_4040 = argv;
  memset(tests_to_run,0,0x2000);
  if (argc < 2) {
    uVar5 = (ulong)(uint)test_count;
    if (test_count < 1) {
      uVar5 = uVar6;
    }
    ptVar3 = ::tests;
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      tests_to_run[uVar6] = ptVar3;
      ptVar3 = ptVar3 + 1;
    }
  }
  else {
    uVar5 = 0;
    for (uVar7 = 1; uVar7 != (uint)argc; uVar7 = uVar7 + 1) {
      memset(tests,0,0x2000);
      n = 0x400;
      name = local_4040[uVar7];
      search_tests(name,tests,&n);
      if (n == 0) {
        fprintf(_stderr,"WARN: No tests matching \"%s\" found.\n",name);
      }
      else {
        uVar2 = (ulong)(uint)n;
        if (n < 1) {
          uVar2 = uVar6;
        }
        for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
          tests_to_run[(long)(int)uVar5 + uVar4] = tests[uVar4];
        }
        uVar5 = (ulong)(uint)((int)uVar5 + (int)uVar4);
      }
    }
  }
  uVar1 = run_tests(tests_to_run,(int)uVar5);
  return uVar1 ^ 1;
}

Assistant:

int main(int argc, char *argv[]){
  struct test *tests_to_run[MAX_TESTS] = {0};
  int tests_to_runc = 0;
  if(1 < argc){
    for(int i=1; i<argc; ++i){
      struct test *tests[MAX_TESTS] = {0};
      int n = MAX_TESTS;
      search_tests(argv[i], tests, &n);
      if(n==0) fprintf(stderr, "WARN: No tests matching \"%s\" found.\n", argv[i]);
      else for(int j=0; j<n; ++j)
             tests_to_run[tests_to_runc++] = tests[j];
    }
  }else{
    for(int i=0; i<test_count; ++i){
      tests_to_run[tests_to_runc++] = &tests[i];
    }
  }

  return !run_tests(tests_to_run, tests_to_runc);
}